

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int128.cc
# Opt level: O0

ostream * google::protobuf::operator<<(ostream *o,uint128 *b)

{
  long lVar1;
  uint64 uVar2;
  uint128 divisor;
  uint128 dividend;
  uint128 divisor_00;
  uint128 dividend_00;
  _Setfill<char> _Var3;
  char cVar4;
  _Ios_Fmtflags _Var5;
  _Ios_Fmtflags __fmtfl;
  _Setw _Var6;
  undefined8 uVar7;
  ostream *poVar8;
  ulong uVar9;
  ulong uVar10;
  streamsize width;
  string rep;
  undefined1 local_248 [8];
  uint128 mid;
  undefined1 local_218 [8];
  uint128 low;
  uint128 high;
  long lStack_1e0;
  fmtflags copy_mask;
  ostringstream os;
  uint128 local_68;
  uint128 local_58;
  uint128 local_48;
  undefined8 local_38;
  streamsize div_base_log;
  uint128 div;
  fmtflags flags;
  uint128 *b_local;
  ostream *o_local;
  
  div.hi_._4_4_ = std::ios_base::flags((ios_base *)(o + *(long *)(*(long *)o + -0x18)));
  uint128::uint128((uint128 *)&div_base_log);
  _Var5 = std::operator&(div.hi_._4_4_,_S_basefield);
  if (_Var5 == _S_hex) {
    uint128::uint128(&local_48,0x1000000000000000);
    div_base_log = local_48.lo_;
    div.lo_ = local_48.hi_;
    local_38 = 0xf;
  }
  else if (_Var5 == _S_oct) {
    uint128::uint128(&local_58,0x8000000000000000);
    div_base_log = local_58.lo_;
    div.lo_ = local_58.hi_;
    local_38 = 0x15;
  }
  else {
    uint128::uint128(&local_68,10000000000000000000);
    div_base_log = local_68.lo_;
    div.lo_ = local_68.hi_;
    local_38 = 0x13;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&stack0xfffffffffffffe20);
  _Var5 = std::operator|(_S_basefield,_S_showbase);
  _Var5 = std::operator|(_Var5,_S_uppercase);
  lVar1 = *(long *)(lStack_1e0 + -0x18);
  __fmtfl = std::operator&(div.hi_._4_4_,_Var5);
  std::ios_base::setf((ios_base *)((long)&stack0xfffffffffffffe20 + lVar1),__fmtfl,_Var5);
  low.hi_ = b->lo_;
  uVar2 = b->hi_;
  uint128::uint128((uint128 *)local_218);
  mid.hi_ = div_base_log;
  dividend_00.hi_ = uVar2;
  dividend_00.lo_ = low.hi_;
  divisor_00.hi_ = div.lo_;
  divisor_00.lo_ = div_base_log;
  uint128::DivModImpl(dividend_00,divisor_00,(uint128 *)&low.hi_,(uint128 *)local_218);
  uint128::uint128((uint128 *)local_248);
  dividend.hi_ = uVar2;
  dividend.lo_ = low.hi_;
  divisor.hi_ = div.lo_;
  divisor.lo_ = div_base_log;
  uint128::DivModImpl(dividend,divisor,(uint128 *)&low.hi_,(uint128 *)local_248);
  if (low.hi_ == 0) {
    if (local_248 != (undefined1  [8])0x0) {
      std::ostream::operator<<(&stack0xfffffffffffffe20,(ulong)local_248);
      uVar7 = std::ostream::operator<<(&stack0xfffffffffffffe20,std::noshowbase);
      _Var3 = std::setfill<char>('0');
      poVar8 = std::operator<<(uVar7,_Var3._M_c);
      rep.field_2._12_4_ = std::setw((int)local_38);
      std::operator<<(poVar8,(_Setw)rep.field_2._12_4_);
    }
  }
  else {
    std::ostream::operator<<(&stack0xfffffffffffffe20,low.hi_);
    uVar7 = std::ostream::operator<<(&stack0xfffffffffffffe20,std::noshowbase);
    _Var3 = std::setfill<char>('0');
    poVar8 = std::operator<<(uVar7,_Var3._M_c);
    _Var6 = std::setw((int)local_38);
    std::operator<<(poVar8,_Var6);
    std::ostream::operator<<(&stack0xfffffffffffffe20,(ulong)local_248);
    _Var6 = std::setw((int)local_38);
    std::operator<<((ostream *)&stack0xfffffffffffffe20,_Var6);
  }
  std::ostream::operator<<(&stack0xfffffffffffffe20,(ulong)local_218);
  std::__cxx11::ostringstream::str();
  uVar9 = std::ios_base::width((ios_base *)(o + *(long *)(*(long *)o + -0x18)),0);
  uVar10 = std::__cxx11::string::size();
  if (uVar10 < uVar9) {
    _Var5 = std::operator&(div.hi_._4_4_,_S_adjustfield);
    if (_Var5 == _S_left) {
      cVar4 = std::__cxx11::string::size();
      std::ios::fill();
      std::__cxx11::string::append((ulong)&width,(char)uVar9 - cVar4);
    }
    else {
      cVar4 = std::__cxx11::string::size();
      std::ios::fill();
      std::__cxx11::string::insert((ulong)&width,0,(char)uVar9 - cVar4);
    }
  }
  poVar8 = std::operator<<(o,(string *)&width);
  std::__cxx11::string::~string((string *)&width);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&stack0xfffffffffffffe20);
  return poVar8;
}

Assistant:

std::ostream& operator<<(std::ostream& o, const uint128& b) {
  std::ios_base::fmtflags flags = o.flags();

  // Select a divisor which is the largest power of the base < 2^64.
  uint128 div;
  std::streamsize div_base_log;
  switch (flags & std::ios::basefield) {
    case std::ios::hex:
      div = static_cast<uint64>(GOOGLE_ULONGLONG(0x1000000000000000));  // 16^15
      div_base_log = 15;
      break;
    case std::ios::oct:
      div = static_cast<uint64>(GOOGLE_ULONGLONG(01000000000000000000000));  // 8^21
      div_base_log = 21;
      break;
    default:  // std::ios::dec
      div = static_cast<uint64>(GOOGLE_ULONGLONG(10000000000000000000));  // 10^19
      div_base_log = 19;
      break;
  }

  // Now piece together the uint128 representation from three chunks of
  // the original value, each less than "div" and therefore representable
  // as a uint64.
  std::ostringstream os;
  std::ios_base::fmtflags copy_mask =
      std::ios::basefield | std::ios::showbase | std::ios::uppercase;
  os.setf(flags & copy_mask, copy_mask);
  uint128 high = b;
  uint128 low;
  uint128::DivModImpl(high, div, &high, &low);
  uint128 mid;
  uint128::DivModImpl(high, div, &high, &mid);
  if (high.lo_ != 0) {
    os << high.lo_;
    os << std::noshowbase << std::setfill('0') << std::setw(div_base_log);
    os << mid.lo_;
    os << std::setw(div_base_log);
  } else if (mid.lo_ != 0) {
    os << mid.lo_;
    os << std::noshowbase << std::setfill('0') << std::setw(div_base_log);
  }
  os << low.lo_;
  std::string rep = os.str();

  // Add the requisite padding.
  std::streamsize width = o.width(0);
  if (width > rep.size()) {
    if ((flags & std::ios::adjustfield) == std::ios::left) {
      rep.append(width - rep.size(), o.fill());
    } else {
      rep.insert(static_cast<std::string::size_type>(0),
                 width - rep.size(), o.fill());
    }
  }

  // Stream the final representation in a single "<<" call.
  return o << rep;
}